

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O2

void __thiscall MinVR::VRError::~VRError(VRError *this)

{
  ~VRError(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

virtual ~VRError() throw (){}